

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O0

bool __thiscall ProString::endsWith(ProString *this,ProString *sub,CaseSensitivity cs)

{
  bool bVar1;
  QString *in_RSI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  QStringView s;
  QString *in_stack_ffffffffffffff58;
  QStringView *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  qsizetype in_stack_ffffffffffffff70;
  qsizetype in_stack_ffffffffffffff78;
  QStringView local_28 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QStringView::QStringView<QString,_true>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  QStringView::mid((QStringView *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                   in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  QStringView::QStringView<QString,_true>(local_28,in_RSI);
  s = QStringView::mid((QStringView *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                       in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  bVar1 = QStringView::endsWith(in_RDI,s,CaseInsensitive);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool endsWith(const ProString &sub, Qt::CaseSensitivity cs = Qt::CaseSensitive) const { return toQStringView().endsWith(sub.toQStringView(), cs); }